

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

bool_t ExprIsIntEx(tchar_t **p,wchar_t Size,intptr_t *Out)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  bool_t bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  
  pcVar8 = *p;
  cVar2 = *pcVar8;
  if ((cVar2 == '-') || (cVar2 == '+')) {
    pcVar8 = pcVar8 + 1;
  }
  bVar4 = IsDigit((int)*pcVar8);
  if (bVar4 != 0) {
    lVar7 = 0;
    iVar3 = Size + L'\xffffffff';
    do {
      iVar6 = iVar3;
      lVar7 = (long)*pcVar8 + lVar7 * 10 + -0x30;
      if (iVar6 == 0) break;
      pcVar1 = pcVar8 + 1;
      pcVar8 = pcVar8 + 1;
      bVar4 = IsDigit((int)*pcVar1);
      iVar3 = iVar6 + -1;
    } while (bVar4 != 0);
    if (iVar6 == 0) {
      lVar5 = -lVar7;
      if (cVar2 != '-') {
        lVar5 = lVar7;
      }
      *Out = lVar5;
      *p = pcVar8 + 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

NOINLINE bool_t ExprIsIntEx(const tchar_t** p,int Size,intptr_t* Out)
{
    const tchar_t* s = *p;
    intptr_t v = 0;

    bool_t Pos = *s == '+';
    bool_t Neg = *s == '-';
    if (Neg || Pos) ++s;

    if (!IsDigit(*s))
        return 0;

    do
    {
        v = v*10 + (*s-'0');
    }
    while (--Size && IsDigit(*(++s)));

    if (Size!=0)
        return 0;

    if (Neg)
        v = -v;

    *Out = v;
    *p = s+1;
    return 1;
}